

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall GlobOpt::TryTailDup(GlobOpt *this,BranchInstr *tailBranch)

{
  Type this_00;
  BranchInstr *this_01;
  FlowGraph *this_02;
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  uint sourceContextId;
  uint functionId;
  Func *pFVar4;
  LabelInstr *this_03;
  BasicBlock *this_04;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar5;
  Type *ppBVar6;
  Instr *instr_00;
  LabelInstr *pLVar7;
  BasicBlock *block;
  BasicBlock *blockSucc;
  undefined4 *puVar8;
  bool local_f9;
  bool local_d9;
  bool local_c9;
  bool local_b9;
  bool local_a9;
  BasicBlock *branchBlock;
  BranchInstr **branchEntry;
  EditingIterator iter;
  uint dupCount;
  uint origPredCount;
  BasicBlock *labelBlock;
  Instr *mergeLabelPrev;
  LabelInstr *mergeLabel;
  Type pBStack_48;
  uint instrCount;
  Instr *instr;
  BranchInstr *tailBranch_local;
  GlobOpt *this_local;
  
  pFVar4 = Func::GetTopFunc((tailBranch->super_Instr).m_func);
  sourceContextId = Func::GetSourceContextId(pFVar4);
  pFVar4 = Func::GetTopFunc((tailBranch->super_Instr).m_func);
  functionId = Func::GetLocalFunctionId(pFVar4);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TailDupPhase,sourceContextId,functionId);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = IR::BranchInstr::IsConditional(tailBranch);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      mergeLabel._4_4_ = 0;
      pBStack_48 = (Type)IR::Instr::GetPrevRealInstrOrLabel(&tailBranch->super_Instr);
      while( true ) {
        IVar3 = IR::Instr::GetKind(&pBStack_48->super_Instr);
        local_a9 = true;
        if (IVar3 != InstrKindLabel) {
          local_a9 = IR::Instr::IsProfiledLabelInstr(&pBStack_48->super_Instr);
        }
        if ((((((local_a9 ^ 0xffU) & 1) == 0) ||
             (bVar2 = IR::Instr::HasBailOutInfo(&pBStack_48->super_Instr), bVar2)) ||
            (bVar2 = OpCodeAttr::CanCSE((pBStack_48->super_Instr).m_opcode), !bVar2)) ||
           (mergeLabel._4_4_ = mergeLabel._4_4_ + 1, 1 < mergeLabel._4_4_)) break;
        pBStack_48 = (Type)IR::Instr::GetPrevRealInstrOrLabel(&pBStack_48->super_Instr);
      }
      IVar3 = IR::Instr::GetKind(&pBStack_48->super_Instr);
      local_b9 = true;
      if (IVar3 != InstrKindLabel) {
        local_b9 = IR::Instr::IsProfiledLabelInstr(&pBStack_48->super_Instr);
      }
      if (local_b9 == false) {
        this_local._7_1_ = false;
      }
      else {
        this_03 = IR::Instr::AsLabelInstr(&pBStack_48->super_Instr);
        labelBlock = (BasicBlock *)(this_03->super_Instr).m_prev;
        while( true ) {
          IVar3 = IR::Instr::GetKind((Instr *)labelBlock);
          local_c9 = true;
          if (IVar3 != InstrKindLabel) {
            local_c9 = IR::Instr::IsProfiledLabelInstr((Instr *)labelBlock);
          }
          local_d9 = false;
          if (local_c9 != false) {
            pLVar7 = IR::Instr::AsLabelInstr((Instr *)labelBlock);
            local_d9 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                                 ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *
                                  )&pLVar7->labelRefs);
          }
          if (local_d9 == false) break;
          labelBlock = *(BasicBlock **)&labelBlock->field_0x18;
        }
        this_04 = IR::LabelInstr::GetBasicBlock(this_03);
        pSVar5 = BasicBlock::GetPredList(this_04);
        iter.super_EditingIterator.last._4_4_ =
             RealCount::Count(&(pSVar5->
                               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
                               super_RealCount);
        iter.super_EditingIterator.last._0_4_ = 0;
        SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                  ((EditingIterator *)&branchEntry,
                   &(this_03->labelRefs).
                    super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>);
        while (bVar2 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::
                       EditingIterator::Next((EditingIterator *)&branchEntry), bVar2) {
          ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              ((Iterator *)&branchEntry);
          bVar2 = IR::BranchInstr::IsUnconditional(*ppBVar6);
          if (((bVar2) && (bVar2 = IR::BranchInstr::IsMultiBranch(*ppBVar6), !bVar2)) &&
             (((BasicBlock *)*ppBVar6 != labelBlock && (*ppBVar6 != tailBranch)))) {
            for (pBStack_48 = (Type)(this_03->super_Instr).m_next; pBStack_48 != tailBranch;
                pBStack_48 = (Type)(pBStack_48->super_Instr).m_next) {
              this_00 = *ppBVar6;
              instr_00 = IR::Instr::Copy(&pBStack_48->super_Instr,true);
              IR::Instr::InsertBefore(&this_00->super_Instr,instr_00);
            }
            pBStack_48 = *ppBVar6;
            this_01 = *ppBVar6;
            pLVar7 = IR::BranchInstr::GetTarget(tailBranch);
            IR::BranchInstr::ReplaceTarget(this_01,this_03,pLVar7);
            while( true ) {
              IVar3 = IR::Instr::GetKind(&pBStack_48->super_Instr);
              local_f9 = true;
              if (IVar3 != InstrKindLabel) {
                local_f9 = IR::Instr::IsProfiledLabelInstr(&pBStack_48->super_Instr);
              }
              if (((local_f9 ^ 0xffU) & 1) == 0) break;
              pBStack_48 = (Type)(pBStack_48->super_Instr).m_prev;
            }
            pLVar7 = IR::Instr::AsLabelInstr(&pBStack_48->super_Instr);
            block = IR::LabelInstr::GetBasicBlock(pLVar7);
            BasicBlock::RemovePred(this_04,block,this->func->m_fg);
            this_02 = this->func->m_fg;
            pLVar7 = IR::BranchInstr::GetTarget(tailBranch);
            blockSucc = IR::LabelInstr::GetBasicBlock(pLVar7);
            FlowGraph::AddEdge(this_02,block,blockSucc);
            iter.super_EditingIterator.last._0_4_ = (uint)iter.super_EditingIterator.last + 1;
          }
        }
        if ((uint)iter.super_EditingIterator.last == iter.super_EditingIterator.last._4_4_) {
          bVar2 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                            ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                             &this_03->labelRefs);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x342,"(mergeLabel->labelRefs.Empty())",
                               "Should not remove block with referenced label.");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          FlowGraph::RemoveBlock(this->func->m_fg,this_04,(GlobOpt *)0x0,true);
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TryTailDup(IR::BranchInstr *tailBranch)
{
    if (PHASE_OFF(Js::TailDupPhase, tailBranch->m_func->GetTopFunc()))
    {
        return false;
    }

    if (tailBranch->IsConditional())
    {
        return false;
    }

    IR::Instr *instr;
    uint instrCount = 0;
    for (instr = tailBranch->GetPrevRealInstrOrLabel(); !instr->IsLabelInstr(); instr = instr->GetPrevRealInstrOrLabel())
    {
        if (instr->HasBailOutInfo())
        {
            break;
        }
        if (!OpCodeAttr::CanCSE(instr->m_opcode))
        {
            // Consider: We could be more aggressive here
            break;
        }

        instrCount++;

        if (instrCount > 1)
        {
            // Consider: If copy handled single-def tmps renaming, we could do more instrs
            break;
        }
    }

    if (!instr->IsLabelInstr())
    {
        return false;
    }

    IR::LabelInstr *mergeLabel = instr->AsLabelInstr();
    IR::Instr *mergeLabelPrev = mergeLabel->m_prev;

    // Skip unreferenced labels
    while (mergeLabelPrev->IsLabelInstr() && mergeLabelPrev->AsLabelInstr()->labelRefs.Empty())
    {
        mergeLabelPrev = mergeLabelPrev->m_prev;
    }

    BasicBlock* labelBlock = mergeLabel->GetBasicBlock();
    uint origPredCount = labelBlock->GetPredList()->Count();
    uint dupCount = 0;

    // We are good to go. Let's do the tail duplication.
    FOREACH_SLISTCOUNTED_ENTRY_EDITING(IR::BranchInstr*, branchEntry, &mergeLabel->labelRefs, iter)
    {
        if (branchEntry->IsUnconditional() && !branchEntry->IsMultiBranch() && branchEntry != mergeLabelPrev && branchEntry != tailBranch)
        {
            for (instr = mergeLabel->m_next; instr != tailBranch; instr = instr->m_next)
            {
                branchEntry->InsertBefore(instr->Copy());
            }

            instr = branchEntry;
            branchEntry->ReplaceTarget(mergeLabel, tailBranch->GetTarget());

            while(!instr->IsLabelInstr())
            {
                instr = instr->m_prev;
            }
            BasicBlock* branchBlock = instr->AsLabelInstr()->GetBasicBlock();

            labelBlock->RemovePred(branchBlock, func->m_fg);
            func->m_fg->AddEdge(branchBlock, tailBranch->GetTarget()->GetBasicBlock());

            dupCount++;
        }
    } NEXT_SLISTCOUNTED_ENTRY_EDITING;

    // If we've duplicated everywhere, tail block is dead and should be removed.
    if (dupCount == origPredCount)
    {
        AssertMsg(mergeLabel->labelRefs.Empty(), "Should not remove block with referenced label.");
        func->m_fg->RemoveBlock(labelBlock, nullptr, true);
    }

    return true;
}